

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  xmlParserErrors code;
  xmlCharEncError xVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *implCtxt;
  uint uVar11;
  xmlCharEncConvImpl impl;
  xmlCharEncoding enc;
  char *name;
  long lVar12;
  long lStack_120;
  uint local_10c;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  
  iVar6 = xmlParserGrow(ctxt);
  if (iVar6 < 0) {
    return;
  }
  pxVar4 = ctxt->input;
  pxVar5 = pxVar4->cur;
  if ((long)pxVar4->end - (long)pxVar5 < 4) {
    return;
  }
  uVar3 = pxVar4->flags;
  xVar1 = *pxVar5;
  if ((uVar3 & 1) != 0) {
    if (xVar1 != 0xef) {
      return;
    }
    if (pxVar5[1] != 0xbb) {
      return;
    }
    if (pxVar5[2] != 0xbf) {
      return;
    }
    pxVar4->cur = pxVar5 + 3;
    return;
  }
  if (xVar1 == 0xff) {
    if (pxVar5[1] != 0xfe) {
      return;
    }
    enc = XML_CHAR_ENCODING_UTF16LE;
    uVar11 = 4;
LAB_0013ffc7:
    lStack_120 = 2;
LAB_0013ffca:
    pxVar4->cur = pxVar5 + lStack_120;
    lStack_120._0_4_ = uVar11;
  }
  else {
    if (xVar1 == '<') {
      if (pxVar5[1] != '\0') {
        return;
      }
      if ((ctxt->html != 0) || (pxVar5[2] != '\0')) {
        if (pxVar5[2] != '?') {
          return;
        }
        if (pxVar5[3] != '\0') {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16LE;
        lStack_120._0_4_ = 4;
        goto LAB_0013ffd2;
      }
      if (pxVar5[3] != '\0') {
        return;
      }
      enc = XML_CHAR_ENCODING_UCS4LE;
    }
    else {
      if (xVar1 == 'L') {
        if (ctxt->html != 0) {
          return;
        }
        if (pxVar5[1] != 'o') {
          return;
        }
        if (pxVar5[2] != 0xa7) {
          return;
        }
        if (pxVar5[3] != 0x94) {
          return;
        }
        pxVar4->flags = uVar3 | 8;
        code = xmlCreateCharEncodingHandler
                         ("IBM037",XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&handler);
        if (code == XML_ERR_OK) {
          local_10c = 199;
          inlen = *(int *)&pxVar4->end - (int)pxVar4->cur;
          xVar7 = xmlEncInputChunk(handler,out,(int *)&local_10c,pxVar4->cur,&inlen,0);
          if (XML_ENC_ERR_INTERNAL < xVar7) {
            uVar8 = (ulong)(int)local_10c;
            out[uVar8] = '\0';
            for (lVar12 = 0; lVar12 < (int)uVar8; lVar12 = lVar12 + 1) {
              if (out[lVar12] == 'e') {
                iVar6 = xmlStrncmp(out + lVar12,"encoding",8);
                if (iVar6 == 0) {
                  uVar8 = lVar12 + 10;
                  goto LAB_0014003c;
                }
                uVar8 = (ulong)local_10c;
              }
              else if (out[lVar12] == '>') break;
            }
          }
LAB_00140108:
          xmlCharEncCloseFunc(handler);
          impl = ctxt->convImpl;
          implCtxt = ctxt->convCtxt;
          name = "IBM037";
LAB_0014012a:
          code = xmlCreateCharEncodingHandler(name,XML_ENC_INPUT,impl,implCtxt,&handler);
          if (code == XML_ERR_OK) {
            xmlSwitchToEncoding(ctxt,handler);
            return;
          }
        }
        xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
        return;
      }
      if (xVar1 == 0xef) {
        if (pxVar5[1] != 0xbb) {
          return;
        }
        if (pxVar5[2] != 0xbf) {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF8;
        uVar11 = 2;
        lStack_120 = 3;
        goto LAB_0013ffca;
      }
      if (xVar1 == 0xfe) {
        if (pxVar5[1] != 0xff) {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar11 = 6;
        goto LAB_0013ffc7;
      }
      if (xVar1 != '\0') {
        return;
      }
      if ((ctxt->html != 0) || (pxVar5[1] != '\0')) {
        if (pxVar5[1] != '<') {
          return;
        }
        if (pxVar5[2] != '\0') {
          return;
        }
        if (pxVar5[3] != '?') {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16BE;
        lStack_120._0_4_ = 6;
        goto LAB_0013ffd2;
      }
      if (pxVar5[2] != '\0') {
        return;
      }
      if (pxVar5[3] != '<') {
        return;
      }
      enc = XML_CHAR_ENCODING_UCS4BE;
    }
    lStack_120._0_4_ = 8;
  }
LAB_0013ffd2:
  pxVar4->flags = (uint)lStack_120 | uVar3;
  xmlSwitchEncoding(ctxt,enc);
  return;
LAB_0014003c:
  uVar9 = (ulong)out[uVar8 - 2];
  if (0x3d < uVar9) goto LAB_00140108;
  if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
    if (uVar9 == 0x3d) goto LAB_00140061;
    goto LAB_00140108;
  }
  uVar8 = uVar8 + 1;
  goto LAB_0014003c;
LAB_00140061:
  uVar9 = (ulong)out[uVar8 - 1];
  if (uVar9 < 0x28) {
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0) goto code_r0x00140077;
    if ((0x8400000000U >> (uVar9 & 0x3f) & 1) != 0) {
      uVar10 = (ulong)(int)uVar8;
      uVar9 = uVar8 & 0xffffffff;
      while (((bVar2 = out[uVar9], (byte)(bVar2 - 0x30) < 10 ||
              ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
             ((bVar2 - 0x2d < 0x33 &&
              ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))))) {
        uVar10 = uVar10 + 1;
        uVar9 = uVar10;
      }
      if (bVar2 != out[uVar8 - 1]) goto LAB_00140108;
      out[uVar10 & 0xffffffff] = '\0';
      xmlCharEncCloseFunc(handler);
      name = (char *)(out + (uVar8 & 0xffffffff));
      impl = ctxt->convImpl;
      implCtxt = ctxt->convCtxt;
      goto LAB_0014012a;
    }
  }
  goto LAB_00140108;
code_r0x00140077:
  uVar8 = uVar8 + 1;
  goto LAB_00140061;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            xmlParserErrors res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}